

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O2

void RGB24PackedToPlanar_SSE2(uint8_t *rgb,__m128i *out)

{
  __m128i tmp [6];
  longlong local_78;
  longlong lStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_78 = *(longlong *)rgb;
  lStack_70 = *(longlong *)(rgb + 8);
  local_68 = *(undefined8 *)(rgb + 0x10);
  uStack_60 = *(undefined8 *)(rgb + 0x18);
  local_58 = *(undefined8 *)(rgb + 0x20);
  uStack_50 = *(undefined8 *)(rgb + 0x28);
  local_48 = *(undefined8 *)(rgb + 0x30);
  uStack_40 = *(undefined8 *)(rgb + 0x38);
  local_38 = *(undefined8 *)(rgb + 0x40);
  uStack_30 = *(undefined8 *)(rgb + 0x48);
  local_28 = *(undefined8 *)(rgb + 0x50);
  uStack_20 = *(undefined8 *)(rgb + 0x58);
  RGB24PackedToPlanarHelper_SSE2((__m128i *)&local_78,out);
  RGB24PackedToPlanarHelper_SSE2(out,(__m128i *)&local_78);
  RGB24PackedToPlanarHelper_SSE2((__m128i *)&local_78,out);
  RGB24PackedToPlanarHelper_SSE2(out,(__m128i *)&local_78);
  RGB24PackedToPlanarHelper_SSE2((__m128i *)&local_78,out);
  return;
}

Assistant:

static WEBP_INLINE void RGB24PackedToPlanar_SSE2(
    const uint8_t* const rgb, __m128i* const out /*out[6]*/) {
  __m128i tmp[6];
  tmp[0] = _mm_loadu_si128((const __m128i*)(rgb +  0));
  tmp[1] = _mm_loadu_si128((const __m128i*)(rgb + 16));
  tmp[2] = _mm_loadu_si128((const __m128i*)(rgb + 32));
  tmp[3] = _mm_loadu_si128((const __m128i*)(rgb + 48));
  tmp[4] = _mm_loadu_si128((const __m128i*)(rgb + 64));
  tmp[5] = _mm_loadu_si128((const __m128i*)(rgb + 80));

  RGB24PackedToPlanarHelper_SSE2(tmp, out);
  RGB24PackedToPlanarHelper_SSE2(out, tmp);
  RGB24PackedToPlanarHelper_SSE2(tmp, out);
  RGB24PackedToPlanarHelper_SSE2(out, tmp);
  RGB24PackedToPlanarHelper_SSE2(tmp, out);
}